

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DBImpl::TEST_CompactMemTable(DBImpl *this)

{
  bool bVar1;
  CondVar *in_RSI;
  Status *in_RDI;
  MutexLock l;
  Status *s;
  Mutex *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  Status *rhs;
  WriteOptions local_12;
  undefined1 local_11;
  
  local_11 = 0;
  rhs = in_RDI;
  memset(&local_12,0,1);
  WriteOptions::WriteOptions(&local_12);
  (**(code **)(*(long *)in_RSI + 0x20))(in_RDI,in_RSI,&local_12,0);
  bVar1 = Status::ok(in_RDI);
  if (bVar1) {
    MutexLock::MutexLock
              ((MutexLock *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    while( true ) {
      bVar1 = false;
      if (*(long *)&in_RSI[0x2a].field_0x8 != 0) {
        bVar1 = Status::ok((Status *)&in_RSI[0x2e].field_0x18);
      }
      if (bVar1 == false) break;
      port::CondVar::Wait(in_RSI);
    }
    if (*(long *)&in_RSI[0x2a].field_0x8 != 0) {
      Status::operator=((Status *)in_RSI,rhs);
    }
    MutexLock::~MutexLock((MutexLock *)0x11097b);
  }
  return (Status)(char *)rhs;
}

Assistant:

Status DBImpl::TEST_CompactMemTable() {
  // nullptr batch means just wait for earlier writes to be done
  Status s = Write(WriteOptions(), nullptr);
  if (s.ok()) {
    // Wait until the compaction completes
    MutexLock l(&mutex_);
    while (imm_ != nullptr && bg_error_.ok()) {
      background_work_finished_signal_.Wait();
    }
    if (imm_ != nullptr) {
      s = bg_error_;
    }
  }
  return s;
}